

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall QVBoxLayout::~QVBoxLayout(QVBoxLayout *this)

{
  QHBoxLayout::~QHBoxLayout((QHBoxLayout *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

QBoxLayout::~QBoxLayout()
{
    Q_D(QBoxLayout);
    d->deleteAll(); // must do it before QObject deletes children, so can't be in ~QBoxLayoutPrivate
}